

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int porterCreate(int argc,char **argv,sqlite3_tokenizer **ppTokenizer)

{
  int iVar1;
  sqlite3_tokenizer *psVar2;
  int iVar3;
  
  iVar1 = sqlite3_initialize();
  iVar3 = 7;
  if (iVar1 == 0) {
    psVar2 = (sqlite3_tokenizer *)sqlite3Malloc(8);
    if (psVar2 != (sqlite3_tokenizer *)0x0) {
      psVar2->pModule = (sqlite3_tokenizer_module *)0x0;
      *ppTokenizer = psVar2;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int porterCreate(
  int argc, const char * const *argv,
  sqlite3_tokenizer **ppTokenizer
){
  porter_tokenizer *t;

  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(argv);

  t = (porter_tokenizer *) sqlite3_malloc(sizeof(*t));
  if( t==NULL ) return SQLITE_NOMEM;
  memset(t, 0, sizeof(*t));
  *ppTokenizer = &t->base;
  return SQLITE_OK;
}